

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char> __thiscall
fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,basic_string_view<char> s,
          basic_format_specs<char> *specs)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  buffer_appender<char> bVar5;
  uint *puVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  buffer<char> *buf;
  ulong uVar10;
  char *data;
  size_t size;
  char *pcVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar12 [16];
  
  puVar6 = (uint *)s.size_;
  pcVar7 = s.data_;
  pcVar4 = (char *)(long)(int)puVar6[1];
  pcVar11 = pcVar7;
  if (pcVar4 < pcVar7) {
    pcVar11 = pcVar4;
  }
  uVar9 = (ulong)*puVar6;
  if ((long)pcVar4 < 0) {
    pcVar11 = pcVar7;
  }
  if (uVar9 == 0) {
    uVar8 = 0;
  }
  else {
    if (pcVar11 == (char *)0x0) {
      uVar8 = 0;
    }
    else {
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar19[8] = 0xc0;
      auVar19._0_8_ = 0xc0c0c0c0c0c0c0c0;
      auVar19[9] = 0xc0;
      auVar19[10] = 0xc0;
      auVar19[0xb] = 0xc0;
      auVar19[0xc] = 0xc0;
      auVar19[0xd] = 0xc0;
      auVar19[0xe] = 0xc0;
      auVar19[0xf] = 0xc0;
      auVar20[8] = 0x80;
      auVar20._0_8_ = 0x8080808080808080;
      auVar20[9] = 0x80;
      auVar20[10] = 0x80;
      auVar20[0xb] = 0x80;
      auVar20[0xc] = 0x80;
      auVar20[0xd] = 0x80;
      auVar20[0xe] = 0x80;
      auVar20[0xf] = 0x80;
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      auVar16 = vpbroadcastq_avx512f();
      uVar8 = 0;
      do {
        auVar17 = vpbroadcastq_avx512f();
        auVar18 = vmovdqa64_avx512f(auVar21);
        auVar21 = vporq_avx512f(auVar17,auVar15);
        uVar10 = vpcmpuq_avx512f(auVar21,auVar16,2);
        auVar12 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                     ((long)out.
                                            super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                            .container + uVar8));
        auVar13[1] = ((byte)(uVar10 >> 1) & 1) * auVar12[1];
        auVar13[0] = ((byte)uVar10 & 1) * auVar12[0];
        auVar13[2] = ((byte)(uVar10 >> 2) & 1) * auVar12[2];
        auVar13[3] = ((byte)(uVar10 >> 3) & 1) * auVar12[3];
        auVar13[4] = ((byte)(uVar10 >> 4) & 1) * auVar12[4];
        auVar13[5] = ((byte)(uVar10 >> 5) & 1) * auVar12[5];
        auVar13[6] = ((byte)(uVar10 >> 6) & 1) * auVar12[6];
        auVar13[7] = (char)(uVar10 >> 7) * auVar12[7];
        auVar13._8_8_ = 0;
        uVar8 = uVar8 + 8;
        auVar12 = vpand_avx(auVar13,auVar19);
        uVar3 = vpcmpb_avx512vl(auVar12,auVar20,4);
        auVar21 = vpmovm2q_avx512dq(uVar3);
        auVar21 = vpsubq_avx512f(auVar18,auVar21);
      } while (((ulong)(pcVar11 + 7) & 0xfffffffffffffff8) != uVar8);
      auVar15 = vmovdqa64_avx512f(auVar21);
      bVar2 = (bool)((byte)uVar10 & 1);
      auVar16._0_8_ = (ulong)bVar2 * auVar15._0_8_ | (ulong)!bVar2 * auVar18._0_8_;
      bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar16._8_8_ = (ulong)bVar2 * auVar15._8_8_ | (ulong)!bVar2 * auVar18._8_8_;
      bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar16._16_8_ = (ulong)bVar2 * auVar15._16_8_ | (ulong)!bVar2 * auVar18._16_8_;
      bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar16._24_8_ = (ulong)bVar2 * auVar15._24_8_ | (ulong)!bVar2 * auVar18._24_8_;
      bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
      auVar16._32_8_ = (ulong)bVar2 * auVar15._32_8_ | (ulong)!bVar2 * auVar18._32_8_;
      bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
      auVar16._40_8_ = (ulong)bVar2 * auVar15._40_8_ | (ulong)!bVar2 * auVar18._40_8_;
      bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
      auVar16._48_8_ = (ulong)bVar2 * auVar15._48_8_ | (ulong)!bVar2 * auVar18._48_8_;
      auVar16._56_8_ =
           (uVar10 >> 7) * auVar15._56_8_ | (ulong)!SUB81(uVar10 >> 7,0) * auVar18._56_8_;
      auVar14 = vextracti64x4_avx512f(auVar16,1);
      auVar15 = vpaddq_avx512f(auVar16,ZEXT3264(auVar14));
      auVar19 = vpaddq_avx(auVar15._0_16_,auVar15._16_16_);
      auVar20 = vpshufd_avx(auVar19,0xee);
      auVar19 = vpaddq_avx(auVar19,auVar20);
      uVar8 = auVar19._0_8_;
    }
    if ((int)*puVar6 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
  }
  uVar10 = 0;
  if (uVar8 <= uVar9) {
    uVar10 = uVar9 - uVar8;
  }
  cVar1 = *(char *)((long)&basic_data<void>::left_padding_shifts +
                   (ulong)(*(byte *)((long)puVar6 + 9) & 0xf));
  if (*(char **)(this + 0x18) <
      pcVar11 + *(byte *)((long)puVar6 + 0xe) * uVar10 + *(long *)(this + 0x10)) {
    (*(code *)**(undefined8 **)this)(this);
  }
  uVar9 = uVar10 >> ((long)cVar1 & 0x3fU);
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)this,uVar9,(fill_t<char> *)((long)puVar6 + 10));
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                    ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,
                     pcVar11 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                     container,bVar5);
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    (bVar5,uVar10 - uVar9,(fill_t<char> *)((long)puVar6 + 10));
  return (buffer_appender<char>)
         bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}